

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

void Gia_ManSetLutRefs(Gia_Man_t *p)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int local_20;
  int iFan;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  if (p->pLutRefs != (int *)0x0) {
    free(p->pLutRefs);
    p->pLutRefs = (int *)0x0;
  }
  iVar1 = Gia_ManObjNum(p);
  piVar2 = (int *)calloc((long)iVar1,4);
  p->pLutRefs = piVar2;
  iFan = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar3 = false;
    if (iFan < iVar1) {
      _k = Gia_ManCo(p,iFan);
      bVar3 = _k != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjFaninId0p(p,_k);
    Gia_ObjLutRefIncId(p,iVar1);
    iFan = iFan + 1;
  }
  for (iFan = 1; iVar1 = Gia_ManObjNum(p), iFan < iVar1; iFan = iFan + 1) {
    iVar1 = Gia_ObjIsLut(p,iFan);
    if (iVar1 != 0) {
      for (local_20 = 0; iVar1 = Gia_ObjLutSize(p,iFan), local_20 < iVar1; local_20 = local_20 + 1)
      {
        piVar2 = Gia_ObjLutFanins(p,iFan);
        Gia_ObjLutRefIncId(p,piVar2[local_20]);
      }
    }
  }
  return;
}

Assistant:

void Gia_ManSetLutRefs( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int i, k, iFan;
    ABC_FREE( p->pLutRefs );
    p->pLutRefs = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ObjLutRefIncId( p, Gia_ObjFaninId0p(p, pObj) );
    Gia_ManForEachLut( p, i )
        Gia_LutForEachFanin( p, i, iFan, k )
            Gia_ObjLutRefIncId( p, iFan );
}